

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

float __thiscall r_exec::View::update_sln_delta(View *this)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float delta;
  View *this_local;
  
  fVar2 = get_sln(this);
  dVar1 = this->initial_sln;
  fVar3 = get_sln(this);
  this->initial_sln = (double)fVar3;
  return (float)((double)fVar2 - dVar1);
}

Assistant:

float View::update_sln_delta()
{
    float delta = get_sln() - initial_sln;
    initial_sln = get_sln();
    return delta;
}